

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PushMacroScope(cmMakefile *this,string *fileName,PolicyMap *pm)

{
  bool bVar1;
  cmState *this_00;
  cmStateSnapshot local_38;
  PolicyMap *local_20;
  PolicyMap *pm_local;
  string *fileName_local;
  cmMakefile *this_local;
  
  local_20 = pm;
  pm_local = (PolicyMap *)fileName;
  fileName_local = (string *)this;
  this_00 = GetState(this);
  cmState::CreateMacroCallSnapshot(&local_38,this_00,&this->StateSnapshot,(string *)pm_local);
  (this->StateSnapshot).State = local_38.State;
  (this->StateSnapshot).Position.Tree = local_38.Position.Tree;
  (this->StateSnapshot).Position.Position = local_38.Position.Position;
  bVar1 = cmStateSnapshot::IsValid(&this->StateSnapshot);
  if (!bVar1) {
    __assert_fail("this->StateSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                  ,0x5fe,
                  "void cmMakefile::PushMacroScope(const std::string &, const cmPolicies::PolicyMap &)"
                 );
  }
  PushFunctionBlockerBarrier(this);
  PushPolicy(this,true,local_20);
  return;
}

Assistant:

void cmMakefile::PushMacroScope(std::string const& fileName,
                                const cmPolicies::PolicyMap& pm)
{
  this->StateSnapshot =
    this->GetState()->CreateMacroCallSnapshot(this->StateSnapshot, fileName);
  assert(this->StateSnapshot.IsValid());

  this->PushFunctionBlockerBarrier();

  this->PushPolicy(true, pm);
}